

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_allocation.cpp
# Opt level: O3

bool __thiscall mocker::detail::MoveInfo::isMoveRelated(MoveInfo *this,Node *n)

{
  const_iterator cVar1;
  const_iterator cVar2;
  long *plVar3;
  
  cVar1 = std::
          _Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::unordered_set<std::shared_ptr<mocker::nasm::Mov>,_mocker::nasm::InstPtrHash,_mocker::nasm::InstPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::unordered_set<std::shared_ptr<mocker::nasm::Mov>,_mocker::nasm::InstPtrHash,_mocker::nasm::InstPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>_>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->associatedMoves)._M_h,n);
  if (cVar1.
      super__Node_iterator_base<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::unordered_set<std::shared_ptr<mocker::nasm::Mov>,_mocker::nasm::InstPtrHash,_mocker::nasm::InstPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    std::__throw_out_of_range("_Map_base::at");
  }
  plVar3 = (long *)((long)cVar1.
                          super__Node_iterator_base<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::unordered_set<std::shared_ptr<mocker::nasm::Mov>,_mocker::nasm::InstPtrHash,_mocker::nasm::InstPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>_>,_true>
                          ._M_cur + 0x28);
  do {
    plVar3 = (long *)*plVar3;
    if (plVar3 == (long *)0x0) break;
    cVar2 = std::
            _Hashtable<std::shared_ptr<mocker::nasm::Mov>,_std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>,_std::__detail::_Identity,_mocker::nasm::InstPtrEqual,_mocker::nasm::InstPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::find(&(this->worklist)._M_h,(key_type *)(plVar3 + 1));
    if (cVar2.super__Node_iterator_base<std::shared_ptr<mocker::nasm::Mov>,_true>._M_cur !=
        (__node_type *)0x0) break;
    cVar2 = std::
            _Hashtable<std::shared_ptr<mocker::nasm::Mov>,_std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>,_std::__detail::_Identity,_mocker::nasm::InstPtrEqual,_mocker::nasm::InstPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::find((_Hashtable<std::shared_ptr<mocker::nasm::Mov>,_std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>,_std::__detail::_Identity,_mocker::nasm::InstPtrEqual,_mocker::nasm::InstPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    *)this,(key_type *)(plVar3 + 1));
  } while (cVar2.super__Node_iterator_base<std::shared_ptr<mocker::nasm::Mov>,_true>._M_cur ==
           (__node_type *)0x0);
  return plVar3 != (long *)0x0;
}

Assistant:

bool MoveInfo::isMoveRelated(const Node &n) const {
  auto &movs = associatedMoves.at(n);
  for (auto &mov : movs) {
    if (isIn(worklist, mov))
      return true;
    if (isIn(active, mov))
      return true;
  }
  return false;
}